

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O2

void google::protobuf::TestUtil::SetOptionalFields<edition_unittest::TestAllTypes>
               (TestAllTypes *message)

{
  TestAllTypes_OptionalGroup *pTVar1;
  TestAllTypes_NestedMessage *pTVar2;
  ForeignMessage *pFVar3;
  ImportMessage *pIVar4;
  PublicImportMessage *pPVar5;
  Reflection *pRVar6;
  Descriptor *pDVar7;
  FieldDescriptor *pFVar8;
  Arena *pAVar9;
  string_view name;
  string_view name_00;
  string_view value;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  *(undefined8 *)((long)&message->field_0 + 0x290) = 0x6700000065;
  (message->field_0)._impl_.optional_int64_ = 0x66;
  (message->field_0)._impl_.optional_uint64_ = 0x68;
  *(undefined8 *)((long)&message->field_0 + 0x2a8) = 0x6b00000069;
  (message->field_0)._impl_.optional_sint64_ = 0x6a;
  (message->field_0)._impl_.optional_fixed64_ = 0x6c;
  *(undefined8 *)((long)&message->field_0 + 0x2c0) = 0x42de00000000006d;
  (message->field_0)._impl_.optional_sfixed64_ = 0x6e;
  (message->field_0)._impl_.optional_double_ = 112.0;
  (message->field_0)._impl_.optional_bool_ = true;
  (message->field_0)._impl_._has_bits_.has_bits_[0] =
       (message->field_0)._impl_._has_bits_.has_bits_[0] | 0xfff801;
  pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_string_,"115",pAVar9);
  *(byte *)&message->field_0 = *(byte *)&message->field_0 | 2;
  pAVar9 = (Arena *)(message->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar9 & 1) != 0) {
    pAVar9 = *(Arena **)((ulong)pAVar9 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(message->field_0)._impl_.optional_bytes_,"116",pAVar9);
  pTVar1 = edition_unittest::TestAllTypes::mutable_optionalgroup(message);
  (pTVar1->field_0)._impl_.a_ = 0x75;
  *(byte *)&pTVar1->field_0 = *(byte *)&pTVar1->field_0 | 1;
  pTVar2 = edition_unittest::TestAllTypes::mutable_optional_nested_message(message);
  (pTVar2->field_0)._impl_.bb_ = 0x76;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
  pFVar3 = edition_unittest::TestAllTypes::mutable_optional_foreign_message(message);
  (pFVar3->field_0)._impl_.c_ = 0x77;
  *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 1;
  pIVar4 = edition_unittest::TestAllTypes::mutable_optional_import_message(message);
  (pIVar4->field_0)._impl_.d_ = 0x78;
  *(byte *)&pIVar4->field_0 = *(byte *)&pIVar4->field_0 | 1;
  pPVar5 = edition_unittest::TestAllTypes::mutable_optional_public_import_message(message);
  (pPVar5->field_0)._impl_.e_ = 0x7e;
  *(byte *)&pPVar5->field_0 = *(byte *)&pPVar5->field_0 | 1;
  pTVar2 = edition_unittest::TestAllTypes::mutable_optional_lazy_message(message);
  (pTVar2->field_0)._impl_.bb_ = 0x7f;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
  pTVar2 = edition_unittest::TestAllTypes::mutable_optional_unverified_lazy_message(message);
  (pTVar2->field_0)._impl_.bb_ = 0x80;
  *(byte *)&pTVar2->field_0 = *(byte *)&pTVar2->field_0 | 1;
  edition_unittest::TestAllTypes::set_optional_nested_enum(message,TestAllTypes_NestedEnum_BAZ);
  edition_unittest::TestAllTypes::set_optional_foreign_enum(message,FOREIGN_BAZ);
  edition_unittest::TestAllTypes::set_optional_import_enum(message,IMPORT_BAZ);
  pRVar6 = edition_unittest::TestAllTypes::GetReflection();
  pDVar7 = edition_unittest::TestAllTypes::GetDescriptor();
  name._M_str = "optional_string_piece";
  name._M_len = 0x15;
  pFVar8 = Descriptor::FindFieldByName(pDVar7,name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"124",&local_59);
  Reflection::SetString(pRVar6,&message->super_Message,pFVar8,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  pRVar6 = edition_unittest::TestAllTypes::GetReflection();
  pDVar7 = edition_unittest::TestAllTypes::GetDescriptor();
  name_00._M_str = "optional_cord";
  name_00._M_len = 0xd;
  pFVar8 = Descriptor::FindFieldByName(pDVar7,name_00);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"125",&local_59);
  Reflection::SetString(pRVar6,&message->super_Message,pFVar8,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  value._M_str = "optional bytes cord";
  value._M_len = 0x13;
  edition_unittest::TestAllTypes::set_optional_bytes_cord(message,value);
  return;
}

Assistant:

void SetOptionalFields(TestAllTypes* message) {
  message->set_optional_int32(101);
  message->set_optional_int64(102);
  message->set_optional_uint32(103);
  message->set_optional_uint64(104);
  message->set_optional_sint32(105);
  message->set_optional_sint64(106);
  message->set_optional_fixed32(107);
  message->set_optional_fixed64(108);
  message->set_optional_sfixed32(109);
  message->set_optional_sfixed64(110);
  message->set_optional_float(111);
  message->set_optional_double(112);
  message->set_optional_bool(true);
  message->set_optional_string("115");
  message->set_optional_bytes("116");

  message->mutable_optionalgroup()->set_a(117);
  message->mutable_optional_nested_message()->set_bb(118);
  message->mutable_optional_foreign_message()->set_c(119);
  message->mutable_optional_import_message()->set_d(120);
  message->mutable_optional_public_import_message()->set_e(126);
  message->mutable_optional_lazy_message()->set_bb(127);
  message->mutable_optional_unverified_lazy_message()->set_bb(128);

  message->set_optional_nested_enum(TestAllTypes::BAZ);
  message->set_optional_foreign_enum(ForeignEnum<TestAllTypes>::FOREIGN_BAZ);
  message->set_optional_import_enum(ImportEnum<TestAllTypes>::IMPORT_BAZ);

  // StringPiece and Cord fields are only accessible via reflection in the
  // open source release; see comments in compiler/cpp/string_field.cc.
#ifndef PROTOBUF_TEST_NO_DESCRIPTORS
  message->GetReflection()->SetString(
      message,
      message->GetDescriptor()->FindFieldByName("optional_string_piece"),
      "124");
  message->GetReflection()->SetString(
      message, message->GetDescriptor()->FindFieldByName("optional_cord"),
      "125");
#endif  // !PROTOBUF_TEST_NO_DESCRIPTORS
  message->set_optional_bytes_cord("optional bytes cord");
}